

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codecvt.cpp
# Opt level: O1

void test_codecvt_in_n_m(cvt_type *cvt,int n,int m)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  wchar_t *pwVar10;
  bool bVar11;
  char *from_next;
  string local_298;
  wchar_t *to_next;
  mbstate_t mb;
  mbstate_t mb2;
  wchar_t buf [128];
  
  from_next = anon_var_dwarf_394d;
  mb.__count = 0;
  mb.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  lVar9 = 0;
  pcVar7 = anon_var_dwarf_394d;
  do {
    pcVar2 = from_next;
    pcVar8 = from_next + n;
    if (anon_var_dwarf_394d + 0x1c < pcVar8) {
      pcVar8 = anon_var_dwarf_394d + 0x1c;
    }
    if (from_next != pcVar7) {
      pcVar8 = pcVar7;
    }
    pcVar7 = pcVar8;
    to_next = buf;
    mb2 = mb;
    iVar3 = (**(code **)(*(long *)cvt + 0x20))
                      (cvt,&mb,from_next,pcVar7,&from_next,to_next,buf + m,&to_next);
    iVar4 = (**(code **)(*(long *)cvt + 0x38))(cvt,&mb2,pcVar2,pcVar7,(long)m);
    test_counter = test_counter + 1;
    if (mb != mb2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x40);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," memcmp(&mb,&mb2,sizeof(mb))==0",0x1f);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      iVar1 = error_counter + 1;
      bVar11 = -1 < error_counter;
      error_counter = iVar1;
      if (bVar11) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_298,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar6,&local_298);
        __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    if ((long)from_next - (long)pcVar2 != (long)iVar4) {
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    test_counter = test_counter + 1;
    if ((long)from_next - (long)pcVar2 != (long)iVar4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x44);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," count == from_next - from",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      iVar4 = error_counter + 1;
      bVar11 = -1 < error_counter;
      error_counter = iVar4;
      if (bVar11) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_298,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar6,&local_298);
        __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    pwVar10 = buf;
    if (iVar3 == 1) {
      pcVar7 = pcVar7 + n;
      if (anon_var_dwarf_394d + 0x1c < pcVar7) {
        pcVar7 = anon_var_dwarf_394d + 0x1c;
      }
    }
    else {
      test_counter = test_counter + 1;
      if (iVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x50);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," r == cvt_type::ok",0x12);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        iVar3 = error_counter + 1;
        bVar11 = -1 < error_counter;
        error_counter = iVar3;
        if (bVar11) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_298,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar6,&local_298);
          __cxa_throw(prVar6,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    for (; pcVar8 = from_next, pwVar10 != to_next; pwVar10 = pwVar10 + 1) {
      test_counter = test_counter + 1;
      if (*(wchar_t *)((long)L"𝒞-привет-やあ.txt" + lVar9) != *pwVar10) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x52);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," *wptr == *to",0xd);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        iVar3 = error_counter + 1;
        bVar11 = -1 < error_counter;
        error_counter = iVar3;
        if (bVar11) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_298,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar6,&local_298);
          __cxa_throw(prVar6,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      lVar9 = lVar9 + 4;
    }
  } while (from_next < anon_var_dwarf_394d + 0x1c);
  test_counter = test_counter + 1;
  if (lVar9 != 0x3c) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x59);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," wptr == wide_name + wlen",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar11 = -1 < error_counter;
    error_counter = iVar3;
    if (bVar11) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      buf._0_8_ = buf + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)buf,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,(string *)buf);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  if (pcVar8 != anon_var_dwarf_394d + 0x1c) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," from == real_end",0x11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar11 = -1 < error_counter;
    error_counter = iVar3;
    if (bVar11) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      buf._0_8_ = buf + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)buf,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,(string *)buf);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void test_codecvt_in_n_m(cvt_type const &cvt,int n,int m)
{
    wchar_t const *wptr = wide_name;
    int wlen = wcslen(wide_name);
    int u8len = strlen(utf8_name);
    char const *from = utf8_name;
    char const *end = from;
    char const *real_end = utf8_name + u8len;
    char const *from_next = from;
    std::mbstate_t mb=std::mbstate_t();
    while(from_next < real_end) {
        if(from == end) {
            end = from + n;
            if(end > real_end)
                end = real_end;
        }
        
        wchar_t buf[128];
        wchar_t *to = buf;
        wchar_t *to_end = to + m;
        wchar_t *to_next = to;
        
        
        std::mbstate_t mb2 = mb;
        std::codecvt_base::result r = cvt.in(mb,from,end,from_next,to,to_end,to_next);
        //std::cout << "In from_size=" << (end-from) << " from move=" <<  (from_next - from) << " to move= " << to_next - to << " state = " << res(r) << std::endl;
       
        int count = cvt.length(mb2,from,end,to_end - to);
        #ifndef BOOSTER_LOCALE_DO_LENGTH_MBSTATE_CONST
        TEST(memcmp(&mb,&mb2,sizeof(mb))==0);
        if(count != from_next - from) {
            std::cout << count << " " << from_next - from << std::endl;
        }
        TEST(count == from_next - from);
        #else
        TEST(count == to_next - to);
        #endif

        
        if(r == cvt_type::partial) {
            end+=n;
            if(end > real_end)
                end = real_end;
        }
        else
            TEST(r == cvt_type::ok);
        while(to!=to_next) {
            TEST(*wptr == *to);
            wptr++;
            to++;
        }
        to=to_next;
        from = from_next;
    }
    TEST(wptr == wide_name + wlen);
    TEST(from == real_end);
    
}